

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.h
# Opt level: O1

void __thiscall Fl_Input_Choice_Type::ideal_size(Fl_Input_Choice_Type *this,int *w,int *h)

{
  Fl_Widget *pFVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  double extraout_XMM0_Qa;
  
  pFVar1 = (this->super_Fl_Menu_Type).super_Fl_Widget_Type.o;
  lVar2 = *(long *)&pFVar1[1].w_;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)*(uint *)(lVar2 + 0xb4),(ulong)*(uint *)(lVar2 + 0xb8));
  iVar3 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  *h = iVar3 + *(int *)(*(long *)&pFVar1[1].w_ + 0xb8) + -6;
  pFVar1 = (this->super_Fl_Menu_Type).super_Fl_Widget_Type.o;
  iVar3 = pFVar1->w_;
  iVar4 = Fl::box_dw((uint)pFVar1->box_);
  *w = (iVar3 - iVar4) + -0x14;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x38])(fl_graphics_driver,0x6d);
  iVar4 = *w + (int)extraout_XMM0_Qa;
  iVar3 = Fl::box_dw((uint)((this->super_Fl_Menu_Type).super_Fl_Widget_Type.o)->box_);
  *w = iVar3 + (iVar4 - (iVar4 + -1) % (int)extraout_XMM0_Qa) + 0x13;
  if (*h < 0xf) {
    *h = 0xf;
  }
  if (*w < *h + 0xf) {
    *w = *h + 0xf;
  }
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    Fl_Input_Choice *myo = (Fl_Input_Choice *)o;
    fl_font(myo->textfont(), myo->textsize());
    h = fl_height() + myo->textsize() - 6;
    w = o->w() - 20 - Fl::box_dw(o->box());
    int ww = (int)fl_width('m');
    w = ((w + ww - 1) / ww) * ww + 20 + Fl::box_dw(o->box());
    if (h < 15) h = 15;
    if (w < (15 + h)) w = 15 + h;
  }